

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O1

void different_types(void)

{
  l[0].type = 'i';
  l[0].val.i = 0;
  r[0].type = 'h';
  r[0].val.d = 4.94065645841247e-324;
  cmp_gt(l,r,1,1,(rtosc_cmp_options *)0x0,"int type","huge int type",0x16d);
  return;
}

Assistant:

void different_types()
{
    l[0].type = 'i';
    l[0].val.i = 0;
    r[0].type = 'h';
    r[0].val.h = 1;

    // 1 > 0, but 'i' > 'h' (alphabetically)
    cmp_gt(l, r, 1, 1, NULL, "int type", "huge int type", __LINE__);
}